

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

void redraw_stuff(player *p)

{
  _Bool _Var1;
  int16_t iVar2;
  flag_event_trigger *hnd;
  ulong uStack_18;
  uint32_t redraw;
  size_t i;
  player *p_local;
  
  hnd._4_4_ = p->upkeep->redraw;
  if ((hnd._4_4_ != 0) && (character_generated)) {
    _Var1 = map_is_visible();
    if (!_Var1) {
      hnd._4_4_ = hnd._4_4_ & 0xf00000;
    }
    iVar2 = player_resting_count(p);
    if ((((int)iVar2 % 100 == 0) && (p->upkeep->running % 100 == 0)) || ((hnd._4_4_ & 0x90000) != 0)
       ) {
      for (uStack_18 = 0; uStack_18 < 0x19; uStack_18 = uStack_18 + 1) {
        if ((hnd._4_4_ & redraw_events[uStack_18].flag) != 0) {
          event_signal(redraw_events[uStack_18].event);
        }
      }
      if ((hnd._4_4_ & 0x10000) != 0) {
        event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
      }
      p->upkeep->redraw = (hnd._4_4_ ^ 0xffffffff) & p->upkeep->redraw;
      _Var1 = map_is_visible();
      if (_Var1) {
        event_signal(EVENT_END);
      }
    }
  }
  return;
}

Assistant:

void redraw_stuff(struct player *p)
{
	size_t i;
	uint32_t redraw = p->upkeep->redraw;

	/* Redraw stuff */
	if (!redraw) return;

	/* Character is not ready yet, no screen updates */
	if (!character_generated) return;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) 
		redraw &= PR_SUBWINDOW;

	/* Hack - rarely update while resting or running, makes it over quicker */
	if (((player_resting_count(p) % 100) || (p->upkeep->running % 100))
		&& !(redraw & (PR_MESSAGE | PR_MAP)))
		return;

	/* For each listed flag, send the appropriate signal to the UI */
	for (i = 0; i < N_ELEMENTS(redraw_events); i++) {
		const struct flag_event_trigger *hnd = &redraw_events[i];

		if (redraw & hnd->flag)
			event_signal(hnd->event);
	}

	/* Then the ones that require parameters to be supplied. */
	if (redraw & PR_MAP) {
		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	p->upkeep->redraw &= ~redraw;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) return;

	/*
	 * Do any plotting, etc. delayed from earlier - this set of updates
	 * is over.
	 */
	event_signal(EVENT_END);
}